

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O0

Status __thiscall
ot::commissioner::persistent_storage::Registry::DeleteBorderRoutersInNetworks
          (Registry *this,StringArray *aAliases,StringArray *aUnresolved)

{
  uint32_t *this_00;
  bool bVar1;
  __type _Var2;
  int iVar3;
  reference __lhs;
  size_type sVar4;
  const_reference __lhs_00;
  reference pNVar5;
  reference pBVar6;
  BorderRouter *br_1;
  iterator __end3;
  iterator __begin3;
  BorderRouterArray *__range3;
  BorderRouter br;
  BorderRouterArray brs;
  Network *nwk;
  iterator __end2_1;
  iterator __begin2_1;
  NetworkArray *__range2_1;
  Network *local_100;
  Network *local_f8;
  __normal_iterator<ot::commissioner::persistent_storage::Network_*,_std::vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>_>
  local_f0;
  __normal_iterator<ot::commissioner::persistent_storage::Network_*,_std::vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>_>
  local_e8;
  __normal_iterator<ot::commissioner::persistent_storage::Network_*,_std::vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>_>
  found;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *alias;
  const_iterator __end2;
  const_iterator __begin2;
  StringArray *__range2;
  undefined1 local_a8 [8];
  Network current;
  NetworkArray nwks;
  Status status;
  StringArray *aUnresolved_local;
  StringArray *aAliases_local;
  Registry *this_local;
  
  std::
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ::vector((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            *)&current.mCcm);
  Network::Network((Network *)local_a8);
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(aAliases);
  alias = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(aAliases);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&alias), bVar1) {
    __lhs = __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&__end2);
    _Var2 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(anonymous_namespace)::ALIAS_THIS_abi_cxx11_);
    if (_Var2) {
      this_local._7_1_ = kRestricted;
      found._M_current._4_4_ = 1;
      goto LAB_0022db3b;
    }
    _Var2 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(anonymous_namespace)::ALIAS_ALL_abi_cxx11_);
    if ((_Var2) ||
       ((_Var2 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(anonymous_namespace)::ALIAS_OTHER_abi_cxx11_), _Var2 &&
        (sVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(aAliases), 1 < sVar4)))) {
      this_local._7_1_ = kDataInvalid;
      found._M_current._4_4_ = 1;
      goto LAB_0022db3b;
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  }
  nwks.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
       GetNetworksByAliases(this,aAliases,(NetworkArray *)&current.mCcm,aUnresolved);
  if (nwks.
      super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ == kSuccess) {
    __lhs_00 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](aAliases,0);
    bVar1 = std::operator!=(__lhs_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(anonymous_namespace)::ALIAS_OTHER_abi_cxx11_);
    if ((!bVar1) ||
       (nwks.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
             GetCurrentNetwork(this,(Network *)local_a8),
       nwks.
       super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ == kSuccess)) {
      if (local_a8._0_4_ != 0xffffffff) {
        local_f0._M_current =
             (Network *)
             std::
             vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
             ::begin((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                      *)&current.mCcm);
        local_f8 = (Network *)
                   std::
                   vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                   ::end((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                          *)&current.mCcm);
        local_100 = (Network *)local_a8;
        local_e8 = std::
                   find_if<__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::Network*,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>>,ot::commissioner::persistent_storage::Registry::DeleteBorderRoutersInNetworks(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                             (local_f0,(__normal_iterator<ot::commissioner::persistent_storage::Network_*,_std::vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>_>
                                        )local_f8,(anon_class_8_1_c685f059_for__M_pred)local_100);
        __range2_1 = (NetworkArray *)
                     std::
                     vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                     ::end((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                            *)&current.mCcm);
        bVar1 = __gnu_cxx::operator==
                          (&local_e8,
                           (__normal_iterator<ot::commissioner::persistent_storage::Network_*,_std::vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>_>
                            *)&__range2_1);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          nwks.
          super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = kRestricted;
          goto LAB_0022db2b;
        }
      }
      __end2_1 = std::
                 vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                 ::begin((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                          *)&current.mCcm);
      nwk = (Network *)
            std::
            vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ::end((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                   *)&current.mCcm);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<ot::commissioner::persistent_storage::Network_*,_std::vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>_>
                                 *)&nwk), bVar1) {
        pNVar5 = __gnu_cxx::
                 __normal_iterator<ot::commissioner::persistent_storage::Network_*,_std::vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>_>
                 ::operator*(&__end2_1);
        std::
        vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
        ::vector((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                  *)&br.mAgent.mPresentFlags);
        BorderRouter::BorderRouter((BorderRouter *)&__range3);
        br._vptr_BorderRouter._4_4_ = (pNVar5->mId).mId;
        iVar3 = (*this->mStorage->_vptr_PersistentStorage[0x17])
                          (this->mStorage,&__range3,&br.mAgent.mPresentFlags);
        nwks.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
             anon_unknown_0::MapStatus((Status)iVar3);
        if (nwks.
            super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ == kSuccess) {
          this_00 = &br.mAgent.mPresentFlags;
          __end3 = std::
                   vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                   ::begin((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                            *)this_00);
          br_1 = (BorderRouter *)
                 std::
                 vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                 ::end((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                        *)this_00);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end3,(__normal_iterator<ot::commissioner::persistent_storage::BorderRouter_*,_std::vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>_>
                                             *)&br_1), bVar1) {
            pBVar6 = __gnu_cxx::
                     __normal_iterator<ot::commissioner::persistent_storage::BorderRouter_*,_std::vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>_>
                     ::operator*(&__end3);
            nwks.
            super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
                 DeleteBorderRouterById(this,&pBVar6->mId);
            if (nwks.
                super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ != kSuccess) {
              found._M_current._4_4_ = 6;
              goto LAB_0022dad1;
            }
            __gnu_cxx::
            __normal_iterator<ot::commissioner::persistent_storage::BorderRouter_*,_std::vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>_>
            ::operator++(&__end3);
          }
          nwks.
          super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
               DropDomainIfEmpty(this,&pNVar5->mDomainId);
          if (nwks.
              super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ == kSuccess) {
            found._M_current._4_4_ = 0;
          }
          else {
            found._M_current._4_4_ = 6;
          }
        }
        else {
          found._M_current._4_4_ = 6;
        }
LAB_0022dad1:
        BorderRouter::~BorderRouter((BorderRouter *)&__range3);
        std::
        vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
        ::~vector((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                   *)&br.mAgent.mPresentFlags);
        if (found._M_current._4_4_ != 0) {
          if (found._M_current._4_4_ != 6) goto LAB_0022db3b;
          break;
        }
        __gnu_cxx::
        __normal_iterator<ot::commissioner::persistent_storage::Network_*,_std::vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>_>
        ::operator++(&__end2_1);
      }
    }
  }
LAB_0022db2b:
  this_local._7_1_ =
       nwks.
       super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_;
  found._M_current._4_4_ = 1;
LAB_0022db3b:
  Network::~Network((Network *)local_a8);
  std::
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ::~vector((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
             *)&current.mCcm);
  return this_local._7_1_;
}

Assistant:

Registry::Status Registry::DeleteBorderRoutersInNetworks(const StringArray &aAliases, StringArray &aUnresolved)
{
    Registry::Status status;
    NetworkArray     nwks;
    Network          current;

    // Check aAliases acceptable
    for (const auto &alias : aAliases)
    {
        if (alias == ALIAS_THIS)
        {
            return Registry::Status::kRestricted;
        }
        if (alias == ALIAS_ALL || (alias == ALIAS_OTHER && aAliases.size() > 1))
        {
            return Registry::Status::kDataInvalid;
        }
    }

    VerifyOrExit((status = GetNetworksByAliases(aAliases, nwks, aUnresolved)) == Registry::Status::kSuccess);

    // Processing explicit network aAliases
    if (aAliases[0] != ALIAS_OTHER)
    {
        VerifyOrExit((status = GetCurrentNetwork(current)) == Registry::Status::kSuccess);
    }

    if (current.mId.mId != EMPTY_ID)
    {
        auto found =
            std::find_if(nwks.begin(), nwks.end(), [&](const Network &a) { return a.mId.mId == current.mId.mId; });
        VerifyOrExit(found == nwks.end(), status = Registry::Status::kRestricted);
    }

    for (const auto &nwk : nwks)
    {
        BorderRouterArray brs;
        BorderRouter      br;

        br.mNetworkId = nwk.mId;
        VerifyOrExit((status = MapStatus(mStorage->Lookup(br, brs))) == Registry::Status::kSuccess);
        for (auto &&br : brs)
        {
            VerifyOrExit((status = DeleteBorderRouterById(br.mId)) == Registry::Status::kSuccess);
        }

        VerifyOrExit((status = DropDomainIfEmpty(nwk.mDomainId)) == Registry::Status::kSuccess);
    }
exit:
    return status;
}